

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O3

void __thiscall tonk::RefCounter::AppRelease(RefCounter *this)

{
  ErrorResult *pEVar1;
  Result local_40;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Application requested shutdown","");
  pEVar1 = (ErrorResult *)operator_new(0x38);
  pEVar1->Source = "AppRelease";
  (pEVar1->Description)._M_dataplus._M_p = (pointer)&(pEVar1->Description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pEVar1->Description,local_38,local_38 + local_30);
  pEVar1->Type = Tonk;
  pEVar1->Code = 0xc;
  local_40.Error = pEVar1;
  StartShutdown(this,0xc,&local_40);
  Result::~Result(&local_40);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  LOCK();
  (this->AppHoldsReference)._M_base._M_i = false;
  UNLOCK();
  return;
}

Assistant:

void RefCounter::AppRelease()
{
    // Begin disconnect if it has not happened yet
    StartShutdown(
        Tonk_AppRequest,
        Result("AppRelease", "Application requested shutdown", ErrorType::Tonk, Tonk_AppRequest));

    AppHoldsReference = false;
}